

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void addColorBits(uchar *out,size_t index,uint bits,uint in)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint local_2c;
  uint p;
  uint m;
  uint in_local;
  uint bits_local;
  size_t index_local;
  uchar *out_local;
  
  if (bits == 1) {
    local_2c = 7;
  }
  else {
    local_2c = 1;
    if (bits == 2) {
      local_2c = 3;
    }
  }
  uVar2 = (uint)index & local_2c;
  bVar1 = (byte)(((1 << ((byte)bits & 0x1f)) - 1U & in) <<
                ((byte)bits * ((char)local_2c - (char)uVar2) & 0x1f));
  if (uVar2 == 0) {
    out[index * bits >> 3] = bVar1;
  }
  else {
    uVar3 = index * bits >> 3;
    out[uVar3] = out[uVar3] | bVar1;
  }
  return;
}

Assistant:

static void addColorBits(unsigned char* out, size_t index, unsigned bits, unsigned in) {
  unsigned m = bits == 1 ? 7 : bits == 2 ? 3 : 1; /*8 / bits - 1*/
  /*p = the partial index in the byte, e.g. with 4 palettebits it is 0 for first half or 1 for second half*/
  unsigned p = index & m;
  in &= (1u << bits) - 1u; /*filter out any other bits of the input value*/
  in = in << (bits * (m - p));
  if(p == 0) out[index * bits / 8u] = in;
  else out[index * bits / 8u] |= in;
}